

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int MRIStepRootInit(void *arkode_mem,int nrtfn,ARKRootFn g)

{
  uint uVar1;
  long *plVar2;
  undefined8 *puVar3;
  long lVar4;
  void *__ptr;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  char *module;
  char *msgfmt;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepRootInit",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    module = "ARKode";
    msgfmt = "arkode_mem = NULL illegal.";
    iVar12 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    iVar17 = -0x15;
    goto LAB_004f7ae2;
  }
  uVar9 = 0;
  if (0 < nrtfn) {
    uVar9 = nrtfn;
  }
  if (*(long *)((long)arkode_mem + 0x280) == 0) {
    puVar3 = (undefined8 *)malloc(0x88);
    *(undefined8 **)((long)arkode_mem + 0x280) = puVar3;
    if (puVar3 == (undefined8 *)0x0) {
      arkProcessError((ARKodeMem)arkode_mem,0,"ARKode","arkRootInit",
                      "Allocation of arkode_mem failed.");
      return -0x14;
    }
    *puVar3 = 0;
    *(undefined4 *)(puVar3 + 1) = 0;
    *(undefined4 *)((long)puVar3 + 100) = 0;
    puVar3[0xe] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    puVar3[7] = 0;
    puVar3[8] = 0;
    puVar3[9] = 0;
    *(undefined4 *)(puVar3 + 0xf) = 1;
    puVar3[0x10] = *(undefined8 *)((long)arkode_mem + 0x10);
    *(long *)((long)arkode_mem + 0x218) = *(long *)((long)arkode_mem + 0x218) + 5;
    *(long *)((long)arkode_mem + 0x220) = *(long *)((long)arkode_mem + 0x220) + 0xc;
  }
  uVar1 = *(uint *)(*(long *)((long)arkode_mem + 0x280) + 8);
  if (0 < (int)uVar1 && uVar9 != uVar1) {
    free(*(void **)(*(long *)((long)arkode_mem + 0x280) + 0x38));
    lVar10 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar10 + 0x38) = 0;
    free(*(void **)(lVar10 + 0x40));
    lVar10 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar10 + 0x40) = 0;
    free(*(void **)(lVar10 + 0x48));
    lVar10 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar10 + 0x48) = 0;
    free(*(void **)(lVar10 + 0x10));
    lVar10 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar10 + 0x10) = 0;
    free(*(void **)(lVar10 + 0x18));
    lVar10 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar10 + 0x18) = 0;
    free(*(void **)(lVar10 + 0x70));
    lVar10 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar10 + 0x70) = 0;
    lVar4 = (long)*(int *)(lVar10 + 8);
    lVar10 = lVar4 * 3;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    *(long *)((long)arkode_mem + 0x218) = *(long *)((long)arkode_mem + 0x218) + lVar4 * -3;
    *(long *)((long)arkode_mem + 0x220) = *(long *)((long)arkode_mem + 0x220) - auVar13._8_8_;
  }
  plVar2 = *(long **)((long)arkode_mem + 0x280);
  if (nrtfn < 1) {
    *(undefined4 *)(plVar2 + 1) = 0;
    *plVar2 = 0;
    return 0;
  }
  if (uVar9 == *(uint *)(plVar2 + 1)) {
    if ((ARKRootFn)*plVar2 == g) {
      return 0;
    }
    if (g != (ARKRootFn)0x0) {
      *plVar2 = (long)g;
      return 0;
    }
    free((void *)plVar2[7]);
    lVar10 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar10 + 0x38) = 0;
    free(*(void **)(lVar10 + 0x40));
    lVar10 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar10 + 0x40) = 0;
    free(*(void **)(lVar10 + 0x48));
    lVar10 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar10 + 0x48) = 0;
    free(*(void **)(lVar10 + 0x10));
    lVar10 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar10 + 0x10) = 0;
    free(*(void **)(lVar10 + 0x18));
    lVar10 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar10 + 0x18) = 0;
    free(*(void **)(lVar10 + 0x70));
    *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x70) = 0;
    *(ulong *)((long)arkode_mem + 0x218) = *(long *)((long)arkode_mem + 0x218) - (ulong)(uVar9 * 3);
    *(ulong *)((long)arkode_mem + 0x220) = *(long *)((long)arkode_mem + 0x220) - (ulong)(uVar9 * 3);
  }
  else {
    *(uint *)(plVar2 + 1) = uVar9;
    if (g != (ARKRootFn)0x0) {
      *plVar2 = (long)g;
      plVar2[7] = 0;
      sVar8 = (ulong)uVar9 * 8;
      __ptr = malloc(sVar8);
      plVar2[7] = (long)__ptr;
      if (__ptr == (void *)0x0) {
LAB_004f7ac0:
        module = "ARKode";
      }
      else {
        plVar2[8] = 0;
        pvVar5 = malloc(sVar8);
        plVar2[8] = (long)pvVar5;
        if (pvVar5 == (void *)0x0) {
          free(__ptr);
          plVar2[7] = 0;
          goto LAB_004f7ac0;
        }
        plVar2[9] = 0;
        pvVar5 = malloc(sVar8);
        plVar2[9] = (long)pvVar5;
        if (pvVar5 == (void *)0x0) {
          free(__ptr);
          plVar2[7] = 0;
          free((void *)plVar2[8]);
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x40) = 0;
          goto LAB_004f7ac0;
        }
        plVar2[2] = 0;
        sVar8 = (ulong)uVar9 << 2;
        pvVar5 = malloc(sVar8);
        plVar2[2] = (long)pvVar5;
        if (pvVar5 == (void *)0x0) {
          free(__ptr);
          plVar2[7] = 0;
          free((void *)plVar2[8]);
          lVar10 = *(long *)((long)arkode_mem + 0x280);
          *(undefined8 *)(lVar10 + 0x40) = 0;
          free(*(void **)(lVar10 + 0x48));
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x48) = 0;
          goto LAB_004f7ac0;
        }
        plVar2[3] = 0;
        pvVar5 = malloc(sVar8);
        plVar2[3] = (long)pvVar5;
        if (pvVar5 == (void *)0x0) {
          free(__ptr);
          plVar2[7] = 0;
          free((void *)plVar2[8]);
          lVar10 = *(long *)((long)arkode_mem + 0x280);
          *(undefined8 *)(lVar10 + 0x40) = 0;
          free(*(void **)(lVar10 + 0x48));
          lVar10 = *(long *)((long)arkode_mem + 0x280);
          *(undefined8 *)(lVar10 + 0x48) = 0;
          free(*(void **)(lVar10 + 0x10));
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x10) = 0;
          goto LAB_004f7ac0;
        }
        plVar2[0xe] = 0;
        pvVar6 = malloc(sVar8);
        plVar2[0xe] = (long)pvVar6;
        if (pvVar6 != (void *)0x0) {
          lVar10 = 0;
          memset(pvVar5,0,(ulong)(uint)nrtfn << 2);
          auVar13 = _DAT_0077bb40;
          uVar7 = 1;
          if (1 < nrtfn) {
            uVar7 = (ulong)(uint)nrtfn;
          }
          lVar4 = uVar7 - 1;
          auVar11._8_4_ = (int)lVar4;
          auVar11._0_8_ = lVar4;
          auVar11._12_4_ = (int)((ulong)lVar4 >> 0x20);
          auVar11 = auVar11 ^ _DAT_0077bb40;
          auVar14 = _DAT_00781f50;
          auVar15 = _DAT_0077bb30;
          do {
            auVar16 = auVar15 ^ auVar13;
            iVar12 = auVar11._4_4_;
            if ((bool)(~(auVar16._4_4_ == iVar12 && auVar11._0_4_ < auVar16._0_4_ ||
                        iVar12 < auVar16._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar6 + lVar10) = 1;
            }
            if ((auVar16._12_4_ != auVar11._12_4_ || auVar16._8_4_ <= auVar11._8_4_) &&
                auVar16._12_4_ <= auVar11._12_4_) {
              *(undefined4 *)((long)pvVar6 + lVar10 + 4) = 1;
            }
            auVar16 = auVar14 ^ auVar13;
            iVar17 = auVar16._4_4_;
            if (iVar17 <= iVar12 && (iVar17 != iVar12 || auVar16._0_4_ <= auVar11._0_4_)) {
              *(undefined4 *)((long)pvVar6 + lVar10 + 8) = 1;
              *(undefined4 *)((long)pvVar6 + lVar10 + 0xc) = 1;
            }
            lVar4 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 4;
            auVar15._8_8_ = lVar4 + 4;
            lVar4 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 4;
            auVar14._8_8_ = lVar4 + 4;
            lVar10 = lVar10 + 0x10;
          } while ((ulong)((int)uVar7 + 3U & 0xfffffffc) << 2 != lVar10);
          *(ulong *)((long)arkode_mem + 0x218) =
               (ulong)(uVar9 * 3) + *(long *)((long)arkode_mem + 0x218);
          *(ulong *)((long)arkode_mem + 0x220) =
               (ulong)(uVar9 * 3) + *(long *)((long)arkode_mem + 0x220);
          return 0;
        }
        free(__ptr);
        plVar2[7] = 0;
        free((void *)plVar2[8]);
        lVar10 = *(long *)((long)arkode_mem + 0x280);
        *(undefined8 *)(lVar10 + 0x40) = 0;
        free(*(void **)(lVar10 + 0x48));
        lVar10 = *(long *)((long)arkode_mem + 0x280);
        *(undefined8 *)(lVar10 + 0x48) = 0;
        free(*(void **)(lVar10 + 0x10));
        lVar10 = *(long *)((long)arkode_mem + 0x280);
        *(undefined8 *)(lVar10 + 0x10) = 0;
        free(*(void **)(lVar10 + 0x18));
        *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x18) = 0;
        module = "ARKodeS";
      }
      msgfmt = "A memory request failed.";
      iVar12 = -0x14;
      iVar17 = -0x14;
      goto LAB_004f7ae2;
    }
  }
  module = "ARKode";
  msgfmt = "g = NULL illegal.";
  iVar12 = -0x16;
  iVar17 = -0x16;
LAB_004f7ae2:
  arkProcessError((ARKodeMem)arkode_mem,iVar17,module,"arkRootInit",msgfmt);
  return iVar12;
}

Assistant:

int MRIStepRootInit(void *arkode_mem, int nrtfn, ARKRootFn g)
{
  /* unpack ark_mem, call arkRootInit, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepRootInit", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkRootInit(ark_mem, nrtfn, g));
}